

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okim6295.c
# Opt level: O1

UINT8 device_start_okim6295(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  uint uVar2;
  DEV_DATA DVar3;
  UINT8 UVar4;
  okim6295_state *chip;
  uint uVar5;
  long lVar6;
  
  DVar3.chipInf = calloc(1,0x118);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    UVar4 = 0xff;
  }
  else {
    lVar6 = 0x20;
    do {
      oki_adpcm_init((oki_adpcm_state *)(lVar6 + (long)DVar3.chipInf),(INT8 *)0x0,(INT16 *)0x0);
      lVar6 = lVar6 + 0x30;
    } while (lVar6 != 0xe0);
    *(undefined2 *)&((DEV_DATA *)((long)DVar3.chipInf + 0xe0))->chipInf = 0xffff;
    *(undefined4 *)((long)DVar3.chipInf + 0xe4) = 0;
    *(undefined1 *)((long)DVar3.chipInf + 0xea) = 0;
    *(undefined4 *)((long)DVar3.chipInf + 0xeb) = 0;
    ((DEV_DATA *)((long)DVar3.chipInf + 0x100))->chipInf = (void *)0x0;
    *(undefined4 *)((long)DVar3.chipInf + 0xfc) = 0;
    UVar1 = cfg->clock;
    *(UINT32 *)&((DEV_DATA *)((long)DVar3.chipInf + 0xf8))->chipInf = UVar1;
    UVar4 = cfg->flags;
    *(UINT8 *)((long)DVar3.chipInf + 0xe9) = UVar4;
    ((DEV_DATA *)((long)DVar3.chipInf + 0x108))->chipInf = (void *)0x0;
    *(UINT32 *)&((DEV_DATA *)((long)DVar3.chipInf + 0xf0))->chipInf = UVar1;
    *(char *)((long)DVar3.chipInf + 0xf4) = (char)UVar1;
    *(char *)((long)DVar3.chipInf + 0xf5) = (char)(UVar1 >> 8);
    *(char *)((long)DVar3.chipInf + 0xf6) = (char)(UVar1 >> 0x10);
    *(char *)((long)DVar3.chipInf + 0xf7) = (char)(UVar1 >> 0x18);
    *(UINT8 *)&((DEV_DATA *)((long)DVar3.chipInf + 0xe8))->chipInf = UVar4;
    lVar6 = 0x4c;
    do {
      *(undefined1 *)((long)DVar3.chipInf + lVar6) = 0;
      lVar6 = lVar6 + 0x30;
    } while (lVar6 != 0x10c);
    uVar5 = 0x84;
    if (UVar4 == '\0') {
      uVar5 = 0xa5;
    }
    *(void **)DVar3.chipInf = DVar3.chipInf;
    uVar2 = *(uint *)((long)DVar3.chipInf + 0xf0);
    UVar4 = '\0';
    retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
    retDevInf->sampleRate = uVar2 / uVar5;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar4;
}

Assistant:

static UINT8 device_start_okim6295(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	okim6295_state *info;
	UINT32 divisor;
	int voicenum;

	info = (okim6295_state *)calloc(1, sizeof(okim6295_state));
	if (info == NULL)
		return 0xFF;

	for (voicenum = 0; voicenum < OKIM6295_VOICES; voicenum++)
		oki_adpcm_init(&info->voice[voicenum].adpcm, NULL, NULL);

	info->command = -1;
	info->bank_offs = 0;
	info->nmk_mode = 0x00;
	memset(info->nmk_bank, 0x00, 4 * sizeof(UINT8));
	info->ROM = NULL;
	info->ROMSize = 0x00;

	info->initial_clock = cfg->clock;
	info->pin7_initial = cfg->flags;
	info->SmpRateFunc = NULL;

	info->master_clock = info->initial_clock;
	WriteLE32(info->clock_buffer, info->master_clock);
	info->pin7_state = info->pin7_initial;
	divisor = info->pin7_state ? 132 : 165;

	okim6295_set_mute_mask(info, 0x00);
	
	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->master_clock / divisor, &devDef);
	return 0x00;
}